

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void add__func__def(c2m_ctx_t c2m_ctx,node_t_conflict func_block,str_t func_name)

{
  size_t op1;
  int iVar1;
  anon_union_16_10_0af5b411_for_u *list_00;
  node_t_conflict pnVar2;
  DLIST_node_t *pDVar3;
  node_t_conflict pnVar4;
  node_t_conflict pnVar5;
  node_t_conflict pnVar6;
  pos_t p;
  undefined1 local_78 [8];
  tab_str_t str;
  node_t_conflict decl_specs;
  node_t_conflict decl;
  node_t_conflict declarator;
  node_t_conflict list;
  pos_t pos;
  node_t_conflict func_block_local;
  c2m_ctx_t c2m_ctx_local;
  str_t func_name_local;
  
  p = get_node_pos(c2m_ctx,func_block);
  iVar1 = str_exists_p(c2m_ctx,"__func__",9,(tab_str_t *)local_78);
  if (iVar1 != 0) {
    str.flags = (size_t)new_pos_node(c2m_ctx,N_LIST,p);
    list_00 = &((node_t_conflict)str.flags)->u;
    pnVar2 = new_pos_node(c2m_ctx,N_STATIC,p);
    DLIST_node_t_append(&list_00->ops,pnVar2);
    pDVar3 = (DLIST_node_t *)(str.flags + 0x20);
    pnVar2 = new_pos_node(c2m_ctx,N_CONST,p);
    DLIST_node_t_append(pDVar3,pnVar2);
    pDVar3 = (DLIST_node_t *)(str.flags + 0x20);
    pnVar2 = new_pos_node(c2m_ctx,N_CHAR,p);
    DLIST_node_t_append(pDVar3,pnVar2);
    pnVar2 = new_pos_node(c2m_ctx,N_LIST,p);
    pnVar4 = new_pos_node(c2m_ctx,N_IGNORE,p);
    pnVar5 = new_pos_node(c2m_ctx,N_LIST,p);
    pnVar6 = new_pos_node(c2m_ctx,N_IGNORE,p);
    pnVar4 = new_pos_node3(c2m_ctx,N_ARR,p,pnVar4,pnVar5,pnVar6);
    DLIST_node_t_append(&(pnVar2->u).ops,pnVar4);
    pnVar4 = new_str_node(c2m_ctx,N_ID,_local_78,p);
    pnVar2 = new_pos_node2(c2m_ctx,N_DECL,p,pnVar4,pnVar2);
    op1 = str.flags;
    pnVar4 = new_node(c2m_ctx,N_IGNORE);
    pnVar5 = new_node(c2m_ctx,N_IGNORE);
    pnVar6 = new_str_node(c2m_ctx,N_STR,func_name,p);
    pnVar2 = new_pos_node5(c2m_ctx,N_SPEC_DECL,p,(node_t_conflict)op1,pnVar2,pnVar4,pnVar5,pnVar6);
    pnVar4 = DLIST_node_t_el(&(func_block->u).ops,1);
    DLIST_node_t_prepend(&(pnVar4->u).ops,pnVar2);
  }
  return;
}

Assistant:

static void add__func__def (c2m_ctx_t c2m_ctx, node_t func_block, str_t func_name) {
  static const char fdecl_name[] = "__func__";
  pos_t pos = POS (func_block);
  node_t list, declarator, decl, decl_specs;
  tab_str_t str;

  if (!str_exists_p (c2m_ctx, fdecl_name, strlen (fdecl_name) + 1, &str)) return;
  decl_specs = new_pos_node (c2m_ctx, N_LIST, pos);
  NL_APPEND (decl_specs->u.ops, new_pos_node (c2m_ctx, N_STATIC, pos));
  NL_APPEND (decl_specs->u.ops, new_pos_node (c2m_ctx, N_CONST, pos));
  NL_APPEND (decl_specs->u.ops, new_pos_node (c2m_ctx, N_CHAR, pos));
  list = new_pos_node (c2m_ctx, N_LIST, pos);
  NL_APPEND (list->u.ops, new_pos_node3 (c2m_ctx, N_ARR, pos, new_pos_node (c2m_ctx, N_IGNORE, pos),
                                         new_pos_node (c2m_ctx, N_LIST, pos),
                                         new_pos_node (c2m_ctx, N_IGNORE, pos)));
  declarator
    = new_pos_node2 (c2m_ctx, N_DECL, pos, new_str_node (c2m_ctx, N_ID, str.str, pos), list);
  decl = new_pos_node5 (c2m_ctx, N_SPEC_DECL, pos, decl_specs, declarator,
                        new_node (c2m_ctx, N_IGNORE), new_node (c2m_ctx, N_IGNORE),
                        new_str_node (c2m_ctx, N_STR, func_name, pos));
  NL_PREPEND (NL_EL (func_block->u.ops, 1)->u.ops, decl);
}